

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O3

TableInterfaceInfo * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::getTableInterfaceInfo
          (TableInterfaceInfo *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,
          Name name)

{
  char *pcVar1;
  long lVar2;
  mapped_type *pmVar3;
  ExternalInterface *pEVar4;
  Name NVar5;
  Name NVar6;
  
  NVar5.super_IString.str._M_str = name.super_IString.str._M_len;
  NVar5.super_IString.str._M_len = (size_t)this->wasm;
  lVar2 = ::wasm::Module::getTable(NVar5);
  if (*(long *)(lVar2 + 0x20) == 0) {
    pEVar4 = this->externalInterface;
    (__return_storage_ptr__->name).super_IString.str._M_len = (size_t)name.super_IString.str._M_len;
    (__return_storage_ptr__->name).super_IString.str._M_str = name.super_IString.str._M_str;
  }
  else {
    pmVar3 = std::
             map<wasm::Name,_std::shared_ptr<wasm::ModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
             ::at(&this->linkedInstances,(key_type *)(lVar2 + 0x18));
    NVar6.super_IString.str._M_str = *(char **)(lVar2 + 0x28);
    NVar6.super_IString.str._M_len =
         (size_t)(((pmVar3->super___shared_ptr<wasm::ModuleRunner,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->super_ModuleRunnerBase<wasm::ModuleRunner>).wasm;
    lVar2 = ::wasm::Module::getExport(NVar6);
    pEVar4 = (((pmVar3->super___shared_ptr<wasm::ModuleRunner,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
             ->super_ModuleRunnerBase<wasm::ModuleRunner>).externalInterface;
    pcVar1 = *(char **)(lVar2 + 0x18);
    (__return_storage_ptr__->name).super_IString.str._M_len = *(size_t *)(lVar2 + 0x10);
    (__return_storage_ptr__->name).super_IString.str._M_str = pcVar1;
  }
  __return_storage_ptr__->interface = pEVar4;
  return __return_storage_ptr__;
}

Assistant:

TableInterfaceInfo getTableInterfaceInfo(Name name) {
    auto* table = wasm.getTable(name);
    if (table->imported()) {
      auto& importedInstance = linkedInstances.at(table->module);
      auto* tableExport = importedInstance->wasm.getExport(table->base);
      return TableInterfaceInfo{importedInstance->externalInterface,
                                tableExport->value};
    } else {
      return TableInterfaceInfo{externalInterface, name};
    }
  }